

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O1

void print<vm::Instruction>(ostream *out,Instruction *t)

{
  mapped_type *ppcVar1;
  __node_base_ptr p_Var2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  _Hash_node_base *p_Var6;
  char *name;
  char *local_20;
  
  ppcVar1 = std::__detail::
            _Map_base<vm::OpCode,_std::pair<const_vm::OpCode,_const_char_*>,_std::allocator<std::pair<const_vm::OpCode,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<vm::OpCode,_std::pair<const_vm::OpCode,_const_char_*>,_std::allocator<std::pair<const_vm::OpCode,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)vm::nameOfOpCode,&t->op);
  local_20 = *ppcVar1;
  p_Var6 = (_Hash_node_base *)0x0;
  p_Var2 = std::
           _Hashtable<vm::OpCode,_std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<vm::OpCode,_std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&vm::paramSizeOfOpCode,(ulong)t->op % DAT_00125440,&t->op,(ulong)t->op);
  pcVar5 = local_20;
  if (p_Var2 != (__node_base_ptr)0x0) {
    p_Var6 = p_Var2->_M_nxt;
  }
  if (p_Var6 != (_Hash_node_base *)0x0) {
    lVar3 = (long)p_Var6[3]._M_nxt - (long)p_Var6[2]._M_nxt >> 2;
    if (lVar3 == 2) {
      printfmt<char_const*,unsigned_int,unsigned_int>(out,"{} {},{}",&local_20,&t->x,&t->y);
      return;
    }
    if (lVar3 == 1) {
      if (local_20 == (char *)0x0) {
        std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
      }
      else {
        sVar4 = strlen(local_20);
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      return;
    }
    if (lVar3 != 0) {
      pcVar5 = "????";
      sVar4 = 4;
      goto LAB_001165b6;
    }
  }
  if (local_20 == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
    return;
  }
  sVar4 = strlen(local_20);
LAB_001165b6:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,sVar4);
  return;
}

Assistant:

inline void print(std::ostream& out, const vm::Instruction& t) {
    const char* name = vm::nameOfOpCode.at(t.op); 
    if (auto it = vm::paramSizeOfOpCode.find(t.op); it != vm::paramSizeOfOpCode.end()) {
        switch (it->second.size()) {
        case 0: print(out, name); break;
        case 1: print(out, name, t.x); break;
        case 2: printfmt(out, "{} {},{}", name, t.x, t.y); break;
        default: print(out, "????"); break;
        }
    }
    else {
        print(out, name);
    }
}